

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,qulonglong a,int fieldWidth,int base
                 ,QChar fillChar)

{
  QStringView s;
  uint flags;
  QStringView s_00;
  QStringView arg;
  QStringView larg;
  undefined1 *puVar1;
  int iVar2;
  NumberOptions NVar3;
  undefined4 extraout_var;
  QLocalePrivate *pQVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  char16_t *pcVar7;
  ArgEscapeData *__return_storage_ptr___00;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QLocale locale;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr___00 = (ArgEscapeData *)&local_58;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pcVar7 = (this->d).ptr;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  findArgEscapes(__return_storage_ptr___00,s);
  puVar1 = local_48;
  if (puStack_50 == (undefined1 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0014f1f0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  else {
    flags = (uint)(fillChar.ucs == L'0') * 2;
    local_78.d = (Data *)0x0;
    local_78.ptr = (storage_type_conflict *)0x0;
    local_78.size = 0;
    qVar5 = 0;
    pcVar8 = (storage_type_conflict *)0x0;
    if ((long)local_48 < (long)puStack_50) {
      iVar2 = QLocaleData::c(__return_storage_ptr___00,pcVar7);
      QLocaleData::unsLongLongToString
                ((QString *)&local_98,(QLocaleData *)CONCAT44(extraout_var,iVar2),a,-1,base,
                 fieldWidth,flags);
      qVar5 = local_98.size;
      pcVar8 = local_98.ptr;
      local_78.d = local_98.d;
      local_98.d = (Data *)0x0;
      local_78.ptr = local_98.ptr;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      local_78.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    local_98.d = (Data *)0x0;
    local_98.ptr = (storage_type_conflict *)0x0;
    local_98.size = 0;
    if ((long)puVar1 < 1) {
      qVar6 = 0;
      pcVar7 = (storage_type_conflict *)0x0;
    }
    else {
      locale.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&locale);
      NVar3 = QLocale::numberOptions(&locale);
      pQVar4 = QSharedDataPointer<QLocalePrivate>::operator->(&locale.d);
      QLocaleData::unsLongLongToString
                ((QString *)&local_b8,pQVar4->m_data,a,-1,base,fieldWidth,
                 (((uint)NVar3.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | flags) ^ 0x20);
      qVar6 = local_b8.size;
      pcVar7 = local_b8.ptr;
      local_98.d = local_b8.d;
      local_b8.d = (Data *)0x0;
      local_98.ptr = local_b8.ptr;
      local_b8.ptr = (storage_type_conflict *)0x0;
      local_b8.size = 0;
      local_98.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QLocale::~QLocale(&locale);
    }
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    arg.m_size = qVar5;
    arg.m_data = pcVar8;
    larg.m_size = qVar6;
    larg.m_data = pcVar7;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_58,(long)fieldWidth,arg,
                      larg,fillChar);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0014f1f0:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::arg_impl(qulonglong a, int fieldWidth, int base, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %lld", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags = QLocaleData::ZeroPadded;

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;
        if (!(locale.numberOptions() & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        localeArg = locale.d->m_data->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}